

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::WriteConnections
          (cmGraphVizWriter *this,string *targetName,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedConnections,cmGeneratedFileStream *str)

{
  char *pcVar1;
  cmGeneratedFileStream *pcVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  iterator iVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  string myNodeName;
  string connectionName;
  allocator local_10a;
  allocator local_109;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_108;
  cmGeneratedFileStream *local_100;
  cmGraphVizWriter *local_f8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  string *local_e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
  *local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c8;
  long local_c0;
  undefined8 *local_b8;
  string local_b0;
  string local_90 [32];
  key_type local_70;
  key_type local_50;
  
  local_e0 = &this->TargetPtrs;
  local_108 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)insertedConnections;
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
          ::find(&local_e0->_M_t,targetName);
  if ((_Rb_tree_header *)cVar3._M_node != &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header) {
    WriteNode(this,targetName,*(cmGeneratorTarget **)(cVar3._M_node + 2),insertedNodes,str);
    if (*(long *)(cVar3._M_node + 2) != 0) {
      local_c8 = &this->TargetNamesNodes;
      local_100 = str;
      local_f0 = insertedNodes;
      local_e8 = targetName;
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_c8->_M_t,targetName);
      std::__cxx11::string::string(local_90,(string *)(cVar4._M_node + 2));
      local_c0 = **(long **)(cVar3._M_node + 2);
      local_d0 = &(this->TargetNamesNodes)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_d8 = (_Base_ptr)(local_108 + 8);
      puVar7 = *(undefined8 **)(local_c0 + 0x1e8);
      local_f8 = this;
      while (puVar7 != *(undefined8 **)(local_c0 + 0x1f0)) {
        pcVar1 = (char *)*puVar7;
        local_b8 = puVar7;
        std::__cxx11::string::string((string *)&local_70,pcVar1,(allocator *)&local_b0);
        cVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&local_c8->_M_t,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (cVar4._M_node != local_d0) {
          std::__cxx11::string::string((string *)&local_70,local_90);
          std::__cxx11::string::append((char *)&local_70);
          std::__cxx11::string::append((string *)&local_70);
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_108,&local_70);
          if (iVar5._M_node == local_d8) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>(local_108,&local_70);
            std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_109);
            std::__cxx11::string::string((string *)&local_50,pcVar1,&local_10a);
            cVar3 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                    ::find(&local_e0->_M_t,&local_50);
            pcVar2 = local_100;
            WriteNode(local_f8,&local_b0,*(cmGeneratorTarget **)(cVar3._M_node + 2),local_f0,
                      local_100);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_b0);
            poVar6 = std::operator<<((ostream *)pcVar2,"    \"");
            poVar6 = std::operator<<(poVar6,local_90);
            poVar6 = std::operator<<(poVar6,"\" -> \"");
            poVar6 = std::operator<<(poVar6,(string *)(cVar4._M_node + 2));
            std::operator<<(poVar6,"\"");
            poVar6 = std::operator<<((ostream *)local_100," // ");
            poVar6 = std::operator<<(poVar6,(string *)local_e8);
            poVar6 = std::operator<<(poVar6," -> ");
            poVar6 = std::operator<<(poVar6,pcVar1);
            std::endl<char,std::char_traits<char>>(poVar6);
            std::__cxx11::string::string((string *)&local_b0,pcVar1,(allocator *)&local_50);
            WriteConnections(local_f8,&local_b0,local_f0,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_108,local_100);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          std::__cxx11::string::~string((string *)&local_70);
        }
        puVar7 = local_b8 + 5;
      }
      std::__cxx11::string::~string(local_90);
    }
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteConnections(
  const std::string& targetName, std::set<std::string>& insertedNodes,
  std::set<std::string>& insertedConnections, cmGeneratedFileStream& str) const
{
  std::map<std::string, const cmGeneratorTarget*>::const_iterator targetPtrIt =
    this->TargetPtrs.find(targetName);

  if (targetPtrIt == this->TargetPtrs.end()) // not found at all
  {
    return;
  }

  this->WriteNode(targetName, targetPtrIt->second, insertedNodes, str);

  if (targetPtrIt->second == CM_NULLPTR) // it's an external library
  {
    return;
  }

  std::string myNodeName = this->TargetNamesNodes.find(targetName)->second;

  const cmTarget::LinkLibraryVectorType* ll =
    &(targetPtrIt->second->Target->GetOriginalLinkLibraries());

  for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
       llit != ll->end(); ++llit) {
    const char* libName = llit->first.c_str();
    std::map<std::string, std::string>::const_iterator libNameIt =
      this->TargetNamesNodes.find(libName);

    // can happen e.g. if GRAPHVIZ_TARGET_IGNORE_REGEX is used
    if (libNameIt == this->TargetNamesNodes.end()) {
      continue;
    }

    std::string connectionName = myNodeName;
    connectionName += "-";
    connectionName += libNameIt->second;
    if (insertedConnections.find(connectionName) ==
        insertedConnections.end()) {
      insertedConnections.insert(connectionName);
      this->WriteNode(libName, this->TargetPtrs.find(libName)->second,
                      insertedNodes, str);

      str << "    \"" << myNodeName << "\" -> \"" << libNameIt->second << "\"";
      str << " // " << targetName << " -> " << libName << std::endl;
      this->WriteConnections(libName, insertedNodes, insertedConnections, str);
    }
  }
}